

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rabinkarphash.h
# Opt level: O3

uint __thiscall
KarpRabinHash<unsigned_int,unsigned_char>::
hash<std::deque<unsigned_char,std::allocator<unsigned_char>>>
          (KarpRabinHash<unsigned_int,unsigned_char> *this,
          deque<unsigned_char,_std::allocator<unsigned_char>_> *c)

{
  uint uVar1;
  _Map_pointer ppuVar2;
  _Elt_pointer puVar3;
  _Map_pointer ppuVar4;
  uint uVar5;
  _Elt_pointer puVar6;
  byte *pbVar7;
  uint uVar8;
  ulong uVar9;
  _Elt_pointer puVar10;
  uint uVar11;
  ulong uVar12;
  
  ppuVar2 = (c->super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  puVar3 = (c->super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  ppuVar4 = (c->super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Deque_impl_data._M_start._M_node;
  uVar5 = 0;
  puVar10 = (c->super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Deque_impl_data._M_start._M_last +
            (long)((c->super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                   super__Deque_impl_data._M_finish._M_cur +
                  ((((((ulong)((long)ppuVar2 - (long)ppuVar4) >> 3) - 1) +
                    (ulong)(ppuVar2 == (_Map_pointer)0x0)) * 0x200 -
                   (long)(c->super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>).
                         _M_impl.super__Deque_impl_data._M_finish._M_first) - (long)puVar3));
  if (puVar10 != (_Elt_pointer)0x0) {
    uVar1 = *(uint *)(this + 0x40c);
    uVar9 = 0;
    uVar5 = 0;
    do {
      if (puVar10 + ~uVar9 == (_Elt_pointer)0x0) {
        uVar11 = 1;
      }
      else {
        uVar8 = 1;
        uVar11 = 1;
        do {
          uVar11 = uVar11 * 0x25 & uVar1;
          puVar6 = (_Elt_pointer)(ulong)uVar8;
          uVar8 = uVar8 + 1;
        } while (puVar6 < puVar10 + ~uVar9);
      }
      puVar6 = puVar3 + (uVar9 - (long)(c->
                                       super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       )._M_impl.super__Deque_impl_data._M_start._M_first);
      if ((long)puVar6 < 0) {
        uVar12 = (long)puVar6 >> 9;
LAB_0010892c:
        pbVar7 = ppuVar4[uVar12] + (long)(puVar6 + uVar12 * -0x200);
      }
      else {
        if ((_Elt_pointer)0x1ff < puVar6) {
          uVar12 = (ulong)puVar6 >> 9;
          goto LAB_0010892c;
        }
        pbVar7 = puVar3 + uVar9;
      }
      uVar5 = uVar5 + (uVar11 * *(int *)(this + (ulong)*pbVar7 * 4 + 0xc) & uVar1) & uVar1;
      uVar9 = uVar9 + 1;
    } while ((_Elt_pointer)(uVar9 & 0xffffffff) < puVar10);
  }
  return uVar5;
}

Assistant:

hashvaluetype hash(container &c) {
    hashvaluetype answer(0);
    for (uint k = 0; k < c.size(); ++k) {
      hashvaluetype x(1);
      for (uint j = 0; j < c.size() - 1 - k; ++j) {
        x = (x * B) & HASHMASK;
      }
      x = (x * hasher.hashvalues[c[k]]) & HASHMASK;
      answer = (answer + x) & HASHMASK;
    }
    return answer;
  }